

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

size_t ZSTD_initDStream(ZSTD_DStream *zds)

{
  uint uVar1;
  size_t code;
  ZSTD_DDict *in_RDI;
  size_t err_code_1;
  size_t err_code;
  ZSTD_DCtx *in_stack_ffffffffffffffd8;
  ZSTD_DCtx *in_stack_fffffffffffffff8;
  
  code = ZSTD_DCtx_reset(in_stack_ffffffffffffffd8,0);
  uVar1 = ERR_isError(code);
  if (uVar1 == 0) {
    code = ZSTD_DCtx_refDDict(in_stack_fffffffffffffff8,in_RDI);
    uVar1 = ERR_isError(code);
    if (uVar1 == 0) {
      code = ZSTD_startingInputLength((ZSTD_format_e)(code >> 0x20));
    }
  }
  return code;
}

Assistant:

size_t ZSTD_initDStream(ZSTD_DStream* zds)
{
    DEBUGLOG(4, "ZSTD_initDStream");
    FORWARD_IF_ERROR(ZSTD_DCtx_reset(zds, ZSTD_reset_session_only), "");
    FORWARD_IF_ERROR(ZSTD_DCtx_refDDict(zds, NULL), "");
    return ZSTD_startingInputLength(zds->format);
}